

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

void Gia_ManSimRelAssignInputs
               (Gia_Man_t *p,int nWords,Vec_Wrd_t *vSims,int nWordsIn,Vec_Wrd_t *vSimsIn)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  if (vSims->nSize != p->nObjs * nWords) {
    __assert_fail("Vec_WrdSize(vSims) == nWords * Gia_ManObjNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                  ,0x2ed,
                  "void Gia_ManSimRelAssignInputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *)")
    ;
  }
  pVVar2 = p->vCis;
  if (vSimsIn->nSize == pVVar2->nSize * nWordsIn) {
    if (0 < pVVar2->nSize) {
      lVar3 = (long)nWordsIn;
      lVar7 = 0;
      do {
        iVar1 = pVVar2->pArray[lVar7];
        if ((iVar1 < 0) || (p->nObjs <= iVar1)) {
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        if (iVar1 == 0) {
          return;
        }
        if (0 < (int)((long)nWords / (long)nWordsIn)) {
          lVar6 = lVar7 * lVar3;
          lVar4 = (long)(iVar1 * nWords);
          uVar5 = (long)nWords / (long)nWordsIn & 0xffffffff;
          do {
            if ((((lVar4 < 0) || ((long)vSims->nSize <= (lVar4 + lVar3) - lVar3)) || (lVar6 < 0)) ||
               (vSimsIn->nSize <= lVar6)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWrd.h"
                            ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
            uVar5 = uVar5 - 1;
            memcpy(vSims->pArray + lVar4,vSimsIn->pArray + lVar6,lVar3 * 8);
            lVar4 = lVar4 + lVar3;
          } while (uVar5 != 0);
          pVVar2 = p->vCis;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 < pVVar2->nSize);
    }
    return;
  }
  __assert_fail("Vec_WrdSize(vSimsIn) == nWordsIn * Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaSimBase.c"
                ,0x2ee,
                "void Gia_ManSimRelAssignInputs(Gia_Man_t *, int, Vec_Wrd_t *, int, Vec_Wrd_t *)");
}

Assistant:

void Gia_ManSimRelAssignInputs( Gia_Man_t * p, int nWords, Vec_Wrd_t * vSims, int nWordsIn, Vec_Wrd_t * vSimsIn )
{
    int i, m, Id, nMints = nWords / nWordsIn;
    assert( Vec_WrdSize(vSims)   == nWords   * Gia_ManObjNum(p) );
    assert( Vec_WrdSize(vSimsIn) == nWordsIn * Gia_ManCiNum(p) );
    Gia_ManForEachCiId( p, Id, i )
        for ( m = 0; m < nMints; m++ )
            memcpy( Vec_WrdEntryP(vSims, Id * nWords + nWordsIn * m), 
                    Vec_WrdEntryP(vSimsIn, i * nWordsIn), sizeof(word) * nWordsIn );
}